

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.cpp
# Opt level: O1

bool __thiscall
sf::priv::ImageLoader::loadImageFromFile
          (ImageLoader *this,string *filename,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pixels,Vector2u *size)

{
  pointer puVar1;
  char *__s;
  stbi_uc *__src;
  ostream *poVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  int height;
  int width;
  int channels;
  uint local_2c;
  uint local_28 [2];
  
  puVar1 = (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  local_28[0] = 0;
  local_2c = 0;
  local_28[1] = 0;
  __src = stbi_load((filename->_M_dataplus)._M_p,(int *)local_28,(int *)&local_2c,
                    (int *)(local_28 + 1),4);
  if (__src == (stbi_uc *)0x0) {
    poVar2 = err();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Failed to load image \"",0x16);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\". Reason: ",0xb);
    __s = *(char **)(in_FS_OFFSET + -0x20);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    size->x = local_28[0];
    size->y = local_2c;
    if (0 < (int)local_2c && 0 < (int)local_28[0]) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (pixels,(ulong)(local_28[0] * local_2c * 4));
      puVar1 = (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      memcpy(puVar1,__src,
             (long)(pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
    }
    free(__src);
  }
  return __src != (stbi_uc *)0x0;
}

Assistant:

bool ImageLoader::loadImageFromFile(const std::string& filename, std::vector<Uint8>& pixels, Vector2u& size)
{
    // Clear the array (just in case)
    pixels.clear();

    // Load the image and get a pointer to the pixels in memory
    int width = 0;
    int height = 0;
    int channels = 0;
    unsigned char* ptr = stbi_load(filename.c_str(), &width, &height, &channels, STBI_rgb_alpha);

    if (ptr)
    {
        // Assign the image properties
        size.x = static_cast<unsigned int>(width);
        size.y = static_cast<unsigned int>(height);

        if (width > 0 && height > 0)
        {
            // Copy the loaded pixels to the pixel buffer
            pixels.resize(static_cast<std::size_t>(width * height * 4));
            memcpy(&pixels[0], ptr, pixels.size());
        }

        // Free the loaded pixels (they are now in our own pixel buffer)
        stbi_image_free(ptr);

        return true;
    }
    else
    {
        // Error, failed to load the image
        err() << "Failed to load image \"" << filename << "\". Reason: " << stbi_failure_reason() << std::endl;

        return false;
    }
}